

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
* deqp::gles2::Performance::textureLookupShaderAttributes
            (vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *__return_storage_ptr__,string *nameSpecialization,ConditionalUsage conditionalUsage,
            ConditionalType conditionalType)

{
  Vector<float,_4> local_338;
  Vector<float,_4> local_328;
  Vector<float,_4> local_318;
  Vector<float,_4> local_308;
  Vector<float,_16> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  AttribSpec local_298;
  Vector<float,_4> local_238;
  Vector<float,_4> local_228;
  Vector<float,_4> local_218;
  Vector<float,_4> local_208;
  Vector<float,_16> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  AttribSpec local_198;
  Vector<float,_4> local_134;
  Vector<float,_4> local_124;
  Vector<float,_4> local_114;
  Vector<float,_4> local_104;
  Vector<float,_16> local_f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  AttribSpec local_88;
  undefined1 local_21;
  ConditionalType local_20;
  ConditionalUsage local_1c;
  ConditionalType conditionalType_local;
  ConditionalUsage conditionalUsage_local;
  string *nameSpecialization_local;
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  *result;
  
  local_21 = 0;
  local_20 = conditionalType;
  local_1c = conditionalUsage;
  _conditionalType_local = nameSpecialization;
  nameSpecialization_local = (string *)__return_storage_ptr__;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::vector(__return_storage_ptr__);
  std::operator+(&local_a8,"a_position",_conditionalType_local);
  tcu::Vector<float,_4>::Vector(&local_104,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_114,-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_124,1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_134,1.0,1.0,0.0,1.0);
  combineVec4ToVec16(&local_f4,&local_104,&local_114,&local_124,&local_134);
  ShaderCompilerCase::AttribSpec::AttribSpec(&local_88,&local_a8,&local_f4);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::push_back(__return_storage_ptr__,&local_88);
  ShaderCompilerCase::AttribSpec::~AttribSpec(&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::operator+(&local_1b8,"a_coords",_conditionalType_local);
  tcu::Vector<float,_4>::Vector(&local_208,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_218,0.0,1.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_228,1.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_238,1.0,1.0,0.0,0.0);
  combineVec4ToVec16(&local_1f8,&local_208,&local_218,&local_228,&local_238);
  ShaderCompilerCase::AttribSpec::AttribSpec(&local_198,&local_1b8,&local_1f8);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::push_back(__return_storage_ptr__,&local_198);
  ShaderCompilerCase::AttribSpec::~AttribSpec(&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  if ((local_1c != CONDITIONAL_USAGE_NONE) && (local_20 == CONDITIONAL_TYPE_DYNAMIC)) {
    std::operator+(&local_2b8,"a_condition",_conditionalType_local);
    tcu::Vector<float,_4>::Vector(&local_308,1.0);
    tcu::Vector<float,_4>::Vector(&local_318,1.0);
    tcu::Vector<float,_4>::Vector(&local_328,1.0);
    tcu::Vector<float,_4>::Vector(&local_338,1.0);
    combineVec4ToVec16(&local_2f8,&local_308,&local_318,&local_328,&local_338);
    ShaderCompilerCase::AttribSpec::AttribSpec(&local_298,&local_2b8,&local_2f8);
    std::
    vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
    ::push_back(__return_storage_ptr__,&local_298);
    ShaderCompilerCase::AttribSpec::~AttribSpec(&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<ShaderCompilerCase::AttribSpec> textureLookupShaderAttributes (const string& nameSpecialization, ConditionalUsage conditionalUsage, ConditionalType conditionalType)
{
	vector<ShaderCompilerCase::AttribSpec> result;

	result.push_back(ShaderCompilerCase::AttribSpec("a_position" + nameSpecialization,
													combineVec4ToVec16(Vec4(-1.0f, -1.0f,  0.0f,  1.0f),
																	   Vec4(-1.0f,  1.0f,  0.0f,  1.0f),
																	   Vec4( 1.0f, -1.0f,  0.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  0.0f,  1.0f))));

	result.push_back(ShaderCompilerCase::AttribSpec("a_coords" + nameSpecialization,
													combineVec4ToVec16(Vec4(0.0f, 0.0f, 0.0f, 0.0f),
																	   Vec4(0.0f, 1.0f, 0.0f, 0.0f),
																	   Vec4(1.0f, 0.0f, 0.0f, 0.0f),
																	   Vec4(1.0f, 1.0f, 0.0f, 0.0f))));

	if (conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_DYNAMIC)
		result.push_back(ShaderCompilerCase::AttribSpec("a_condition" + nameSpecialization,
														combineVec4ToVec16(Vec4(1.0f), Vec4(1.0f), Vec4(1.0f), Vec4(1.0f))));

	return result;
}